

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O3

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::getHeld(TestMoreStuffImpl *this,GetHeldContext context)

{
  ClientHook *pCVar1;
  long *in_RDX;
  Own<kj::_::ImmediatePromiseNode<kj::_::Void>_> OVar2;
  Promise<void> PVar3;
  Builder result;
  Own<capnp::ClientHook> local_90;
  WirePointer *local_80;
  PointerBuilder local_78;
  undefined1 local_60;
  StructBuilder local_48;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  local_60 = 0;
  (**(code **)(*in_RDX + 0x10))(&local_90);
  local_78.pointer = local_80;
  local_78.segment = (SegmentBuilder *)local_90.disposer;
  local_78.capTable = (CapTableBuilder *)local_90.ptr;
  PointerBuilder::getStruct(&local_48,&local_78,(StructSize)0x10000,(word *)0x0);
  local_78.segment = (SegmentBuilder *)CONCAT44(local_48.segment._4_4_,local_48.segment._0_4_);
  local_78.capTable = (CapTableBuilder *)CONCAT44(local_48.capTable._4_4_,local_48.capTable._0_4_);
  local_78.pointer = local_48.pointers;
  (**(code **)(**(long **)(context.hook[3]._vptr_CallContextHook[-3] +
                          (long)&context.hook[4]._vptr_CallContextHook) + 0x20))(&local_90);
  PointerBuilder::setCapability(&local_78,&local_90);
  pCVar1 = local_90.ptr;
  if (local_90.ptr != (ClientHook *)0x0) {
    local_90.ptr = (ClientHook *)0x0;
    (*(code *)((SegmentReader *)&(local_90.disposer)->_vptr_Disposer)->arena->_vptr_Arena)
              (local_90.disposer,
               (_func_int *)((long)&pCVar1->_vptr_ClientHook + (long)pCVar1->_vptr_ClientHook[-2]));
  }
  OVar2 = kj::heap<kj::_::ImmediatePromiseNode<kj::_::Void>,kj::_::Void>((Void *)&local_78);
  PVar3.super_PromiseBase.node.ptr = OVar2.ptr;
  *(SegmentBuilder **)&this->super_Server = local_78.segment;
  *(CapTableBuilder **)&(this->super_Server).field_0x8 = local_78.capTable;
  PVar3.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar3.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::getHeld(GetHeldContext context) {
  ++callCount;
  auto result = context.getResults();
  result.setCap(clientToHold);
  return kj::READY_NOW;
}